

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::DataBuilderCollationIterator::fetchCEs
          (DataBuilderCollationIterator *this,UnicodeString *str,int32_t start,int64_t *ces,
          int32_t cesLength)

{
  short sVar1;
  int32_t offset;
  CollationDataBuilder *pCVar2;
  UnicodeString *this_00;
  long *plVar3;
  long lVar4;
  int32_t iVar5;
  uint uVar6;
  uint32_t ce32;
  char16_t *pcVar7;
  ulong uVar8;
  ulong uVar9;
  CollationData *this_01;
  UErrorCode errorCode;
  CollationData *local_38;
  
  pCVar2 = this->builder;
  local_38 = &this->builderData;
  (this->builderData).ce32s = (uint32_t *)(pCVar2->ce32s).elements;
  (this->builderData).ces = (pCVar2->ce64s).elements;
  pcVar7 = UnicodeString::getBuffer(&pCVar2->contexts);
  (this->builderData).contexts = pcVar7;
  CollationIterator::reset(&this->super_CollationIterator);
  this->s = str;
  this->pos = start;
  errorCode = U_ZERO_ERROR;
  while( true ) {
    if (U_ZERO_ERROR < errorCode) {
      return cesLength;
    }
    this_00 = this->s;
    sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    offset = this->pos;
    if (iVar5 <= offset) break;
    (this->super_CollationIterator).ceBuffer.length = 0;
    (this->super_CollationIterator).cesIndex = 0;
    uVar6 = UnicodeString::char32At(this_00,offset);
    this->pos = (this->pos - (uint)(uVar6 < 0x10000)) + 2;
    ce32 = utrie2_get32_63(this->builder->trie,uVar6);
    this_01 = local_38;
    if (ce32 == 0xc0) {
      this_01 = this->builder->base;
      ce32 = CollationData::getCE32(this_01,uVar6);
    }
    CollationIterator::appendCEsFromCE32
              (&this->super_CollationIterator,this_01,uVar6,ce32,'\x01',&errorCode);
    uVar6 = (this->super_CollationIterator).ceBuffer.length;
    plVar3 = (this->super_CollationIterator).ceBuffer.buffer.ptr;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar8 = 0;
    }
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      lVar4 = plVar3[uVar9];
      if (lVar4 != 0) {
        if (cesLength < 0x1f) {
          ces[cesLength] = lVar4;
        }
        cesLength = cesLength + 1;
      }
    }
  }
  return cesLength;
}

Assistant:

int32_t
DataBuilderCollationIterator::fetchCEs(const UnicodeString &str, int32_t start,
                                       int64_t ces[], int32_t cesLength) {
    // Set the pointers each time, in case they changed due to reallocation.
    builderData.ce32s = reinterpret_cast<const uint32_t *>(builder.ce32s.getBuffer());
    builderData.ces = builder.ce64s.getBuffer();
    builderData.contexts = builder.contexts.getBuffer();
    // Modified copy of CollationIterator::nextCE() and CollationIterator::nextCEFromCE32().
    reset();
    s = &str;
    pos = start;
    UErrorCode errorCode = U_ZERO_ERROR;
    while(U_SUCCESS(errorCode) && pos < s->length()) {
        // No need to keep all CEs in the iterator buffer.
        clearCEs();
        UChar32 c = s->char32At(pos);
        pos += U16_LENGTH(c);
        uint32_t ce32 = utrie2_get32(builder.trie, c);
        const CollationData *d;
        if(ce32 == Collation::FALLBACK_CE32) {
            d = builder.base;
            ce32 = builder.base->getCE32(c);
        } else {
            d = &builderData;
        }
        appendCEsFromCE32(d, c, ce32, /*forward=*/ TRUE, errorCode);
        U_ASSERT(U_SUCCESS(errorCode));
        for(int32_t i = 0; i < getCEsLength(); ++i) {
            int64_t ce = getCE(i);
            if(ce != 0) {
                if(cesLength < Collation::MAX_EXPANSION_LENGTH) {
                    ces[cesLength] = ce;
                }
                ++cesLength;
            }
        }
    }
    return cesLength;
}